

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int m_flush_block_resumable(aec_stream *strm)

{
  size_t *psVar1;
  size_t sVar2;
  internal_state *piVar3;
  ulong uVar4;
  size_t __n;
  
  piVar3 = strm->state;
  uVar4 = (long)piVar3->cds - (long)(piVar3->cds_buf + piVar3->i);
  if (strm->avail_out <= uVar4) {
    uVar4 = strm->avail_out;
  }
  __n = (size_t)(int)uVar4;
  memcpy(strm->next_out,piVar3->cds_buf + piVar3->i,__n);
  strm->next_out = strm->next_out + __n;
  psVar1 = &strm->avail_out;
  *psVar1 = *psVar1 - __n;
  sVar2 = *psVar1;
  piVar3->i = piVar3->i + (int)uVar4;
  if (sVar2 != 0) {
    piVar3->mode = m_get_block;
  }
  return (uint)(sVar2 != 0);
}

Assistant:

static int m_flush_block_resumable(struct aec_stream *strm)
{
    /**
       Slow and restartable flushing
    */
    struct internal_state *state = strm->state;

    int n = (int)MIN((size_t)(state->cds - state->cds_buf - state->i),
                     strm->avail_out);
    memcpy(strm->next_out, state->cds_buf + state->i, n);
    strm->next_out += n;
    strm->avail_out -= n;
    state->i += n;

    if (strm->avail_out == 0) {
        return M_EXIT;
    } else {
        state->mode = m_get_block;
        return M_CONTINUE;
    }
}